

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O0

void __thiscall
slang::ast::CoverCrossSymbol::visitExprs<xilinx_do_not_care_values::MainVisitor&>
          (CoverCrossSymbol *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  Expression *in_RDI;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  Expression *expr;
  AlwaysFFVisitor *in_stack_ffffffffffffffb8;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
  local_28;
  SourceLocation *local_20;
  Expression *local_18;
  
  local_18 = getIffExpr(this);
  if (local_18 != (Expression *)0x0) {
    Expression::visit<xilinx_do_not_care_values::MainVisitor&>(in_RDI,in_stack_ffffffffffffffb8);
  }
  local_20 = &in_RDI[2].sourceRange.endLoc;
  local_28._M_current =
       (CoverageOptionSetter *)
       std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
                  in_stack_ffffffffffffffb8);
  std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
    ::operator*(&local_28);
    CoverageOptionSetter::visitExprs<xilinx_do_not_care_values::MainVisitor&>
              ((CoverageOptionSetter *)in_RDI,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CoverageOptionSetter_*,_std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (auto expr = getIffExpr())
            expr->visit(visitor);

        for (auto& opt : options)
            opt.visitExprs(visitor);
    }